

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

FrameOpResult __thiscall
QRhiGles2::beginOffscreenFrame(QRhiGles2 *this,QRhiCommandBuffer **cb,BeginFrameFlags param_2)

{
  QGles2CommandBuffer *this_00;
  GLuint GVar1;
  int iVar2;
  int iVar3;
  Command *pCVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  FrameOpResult FVar7;
  ulong uVar8;
  Command *__dest;
  
  bVar6 = ensureContext(this,(QSurface *)0x0);
  if (bVar6) {
    (this->ofr).active = true;
    executeDeferredReleases(this);
    this_00 = &(this->ofr).cbWrapper;
    (this->ofr).cbWrapper.recordingPass = NoPass;
    (this->ofr).cbWrapper.passNeedsResourceTracking = true;
    (this->ofr).cbWrapper.currentTarget = (QRhiRenderTarget *)0x0;
    QGles2CommandBuffer::resetCommands(this_00);
    (this->ofr).cbWrapper.currentPipelineGeneration = 0;
    (this->ofr).cbWrapper.currentGraphicsPipeline = (QRhiGraphicsPipeline *)0x0;
    (this->ofr).cbWrapper.currentComputePipeline = (QRhiComputePipeline *)0x0;
    (this->ofr).cbWrapper.currentGraphicsSrb = (QRhiShaderResourceBindings *)0x0;
    (this->ofr).cbWrapper.currentComputeSrb = (QRhiShaderResourceBindings *)0x0;
    *(undefined8 *)((long)&(this->ofr).cbWrapper.currentComputeSrb + 5) = 0;
    QHash<QRhiResource_*,_std::pair<int,_bool>_>::clear
              (&(this->ofr).cbWrapper.computePassState.writtenResources);
    memset((this->ofr).cbWrapper.textureUnitState,0,0x100);
    if (((((this->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.super_QFlagsStorage<QRhi::Flag>
           .i & 8) != 0) && (((this->caps).field_0x3c & 0x40) != 0)) &&
       ((this->ofr).tsQueries[0] == 0)) {
      (*(this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions[7])
                (2,(this->ofr).tsQueries);
    }
    GVar1 = (this->ofr).tsQueries[0];
    iVar2 = (this->ofr).cbWrapper.commands.p;
    iVar3 = (this->ofr).cbWrapper.commands.a;
    if (iVar2 == iVar3) {
      uVar8 = (long)iVar3 + 0x400;
      (this->ofr).cbWrapper.commands.a = (int)uVar8;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar8;
      uVar8 = 0xffffffffffffffff;
      if (SUB168(auVar5 * ZEXT816(0x68),8) == 0) {
        uVar8 = SUB168(auVar5 * ZEXT816(0x68),0);
      }
      __dest = (Command *)operator_new__(uVar8);
      pCVar4 = (this->ofr).cbWrapper.commands.v;
      if (pCVar4 != (Command *)0x0) {
        memcpy(__dest,pCVar4,(long)iVar2 * 0x68);
        operator_delete__(pCVar4);
      }
      (this->ofr).cbWrapper.commands.v = __dest;
    }
    pCVar4 = (this->ofr).cbWrapper.commands.v;
    iVar2 = (this->ofr).cbWrapper.commands.p;
    (this->ofr).cbWrapper.commands.p = iVar2 + 1;
    pCVar4[iVar2].cmd = BeginFrame;
    pCVar4[iVar2].args.beginFrame.timestampQuery = GVar1;
    *cb = &this_00->super_QRhiCommandBuffer;
    FVar7 = FrameOpSuccess;
  }
  else {
    FVar7 = (uint)this->contextLost * 2 + FrameOpError;
  }
  return FVar7;
}

Assistant:

QRhi::FrameOpResult QRhiGles2::beginOffscreenFrame(QRhiCommandBuffer **cb, QRhi::BeginFrameFlags)
{
    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    ofr.active = true;

    executeDeferredReleases();
    ofr.cbWrapper.resetState();

    if (rhiFlags.testFlag(QRhi::EnableTimestamps) && caps.timestamps) {
        if (!ofr.tsQueries[0])
            f->glGenQueries(2, ofr.tsQueries);
    }

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::BeginFrame, ofr.tsQueries[0]);
    *cb = &ofr.cbWrapper;

    return QRhi::FrameOpSuccess;
}